

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O0

void __thiscall QGraphicsProxyWidget::~QGraphicsProxyWidget(QGraphicsProxyWidget *this)

{
  bool bVar1;
  QWidget *pQVar2;
  QObject *in_RDI;
  QGraphicsProxyWidgetPrivate *d;
  QWindow *in_stack_00000068;
  
  *(undefined ***)in_RDI = &PTR_metaObject_00d340e8;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QGraphicsProxyWidget_00d342c8;
  *(undefined ***)(in_RDI + 0x20) = &PTR__QGraphicsProxyWidget_00d34400;
  d_func((QGraphicsProxyWidget *)0x9babfc);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x9bac12);
  if (bVar1) {
    pQVar2 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x9bac29);
    QObject::removeEventFilter(&pQVar2->super_QObject);
    pQVar2 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9bac47);
    QObject::disconnect(&pQVar2->super_QObject,"2destroyed()",in_RDI,"1_q_removeWidgetSlot()");
    pQVar2 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x9bac73);
    if (pQVar2 != (QWidget *)0x0) {
      (**(code **)(*(long *)pQVar2 + 0x20))();
    }
  }
  QGraphicsWidget::~QGraphicsWidget(in_stack_00000068);
  return;
}

Assistant:

QGraphicsProxyWidget::~QGraphicsProxyWidget()
{
    Q_D(QGraphicsProxyWidget);
    if (d->widget) {
        d->widget->removeEventFilter(this);
        QObject::disconnect(d->widget, SIGNAL(destroyed()), this, SLOT(_q_removeWidgetSlot()));
        delete d->widget;
    }
}